

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O2

void Eigen::internal::
     set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>>
               (__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                *begin,__normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
                       *end,SparseMatrix<double,_0,_int> *mat,int Options)

{
  int iVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Triplet<double,_int> *pTVar4;
  undefined1 local_88 [8];
  SparseMatrix<double,_1,_int> trMat;
  undefined1 local_40 [8];
  Matrix<int,__1,_1,_0,__1,_1> wi;
  
  SparseMatrix<double,_1,_int>::SparseMatrix
            ((SparseMatrix<double,_1,_int> *)local_88,mat->m_innerSize,mat->m_outerSize);
  if (begin->_M_current != end->_M_current) {
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)local_40,(long)(int)local_88._4_4_);
    DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_40);
    for (pTVar4 = begin->_M_current; pTVar4 != end->_M_current; pTVar4 = pTVar4 + 1) {
      iVar1 = pTVar4->m_row;
      if (((((long)iVar1 < 0) || (mat->m_innerSize <= iVar1)) || (pTVar4->m_col < 0)) ||
         (mat->m_outerSize <= pTVar4->m_col)) {
        __assert_fail("it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseMatrix.h"
                      ,0x3b8,
                      "void Eigen::internal::set_from_triplets(const InputIterator &, const InputIterator &, SparseMatrixType &, int) [InputIterator = __gnu_cxx::__normal_iterator<Eigen::Triplet<double> *, std::vector<Eigen::Triplet<double>>>, SparseMatrixType = Eigen::SparseMatrix<double>]"
                     );
      }
      pSVar2 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)local_40,
                          (long)iVar1);
      *pSVar2 = *pSVar2 + 1;
    }
    SparseMatrix<double,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
              ((SparseMatrix<double,1,int> *)local_88,(Matrix<int,__1,_1,_0,__1,_1> *)local_40);
    for (pTVar4 = begin->_M_current; pTVar4 != end->_M_current; pTVar4 = pTVar4 + 1) {
      trMat.m_data.m_allocatedSize = (size_t)pTVar4->m_value;
      pSVar3 = SparseMatrix<double,_1,_int>::insertBackUncompressed
                         ((SparseMatrix<double,_1,_int> *)local_88,pTVar4->m_row,pTVar4->m_col);
      *pSVar3 = (Scalar)trMat.m_data.m_allocatedSize;
    }
    SparseMatrix<double,_1,_int>::sumupDuplicates((SparseMatrix<double,_1,_int> *)local_88);
    free((void *)local_40);
  }
  SparseMatrix<double,0,int>::operator=
            ((SparseMatrix<double,0,int> *)mat,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_> *)local_88);
  SparseMatrix<double,_1,_int>::~SparseMatrix((SparseMatrix<double,_1,_int> *)local_88);
  return;
}

Assistant:

void set_from_triplets(const InputIterator& begin, const InputIterator& end, SparseMatrixType& mat, int Options = 0)
{
  EIGEN_UNUSED_VARIABLE(Options);
  enum { IsRowMajor = SparseMatrixType::IsRowMajor };
  typedef typename SparseMatrixType::Scalar Scalar;
  typedef typename SparseMatrixType::Index Index;
  SparseMatrix<Scalar,IsRowMajor?ColMajor:RowMajor,Index> trMat(mat.rows(),mat.cols());

  if(begin!=end)
  {
    // pass 1: count the nnz per inner-vector
    Matrix<Index,Dynamic,1> wi(trMat.outerSize());
    wi.setZero();
    for(InputIterator it(begin); it!=end; ++it)
    {
      eigen_assert(it->row()>=0 && it->row()<mat.rows() && it->col()>=0 && it->col()<mat.cols());
      wi(IsRowMajor ? it->col() : it->row())++;
    }

    // pass 2: insert all the elements into trMat
    trMat.reserve(wi);
    for(InputIterator it(begin); it!=end; ++it)
      trMat.insertBackUncompressed(it->row(),it->col()) = it->value();

    // pass 3:
    trMat.sumupDuplicates();
  }

  // pass 4: transposed copy -> implicit sorting
  mat = trMat;
}